

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O2

CURLcode Curl_pollfds_add_ps(curl_pollfds *cpfds,easy_pollset *ps)

{
  short events;
  CURLcode CVar1;
  ulong uVar2;
  
  uVar2 = 0;
  while( true ) {
    if (ps->num <= uVar2) {
      return CURLE_OK;
    }
    events = (ps->actions[uVar2] & 1) + (ps->actions[uVar2] & 2) * 2;
    if (((char)events != '\0') &&
       (CVar1 = cpfds_add_sock(cpfds,ps->sockets[uVar2],events,true), CVar1 != CURLE_OK)) break;
    uVar2 = uVar2 + 1;
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_pollfds_add_ps(struct curl_pollfds *cpfds,
                             struct easy_pollset *ps)
{
  size_t i;

  DEBUGASSERT(cpfds);
  DEBUGASSERT(ps);
  for(i = 0; i < ps->num; i++) {
    short events = 0;
    if(ps->actions[i] & CURL_POLL_IN)
      events |= POLLIN;
    if(ps->actions[i] & CURL_POLL_OUT)
      events |= POLLOUT;
    if(events) {
      if(cpfds_add_sock(cpfds, ps->sockets[i], events, TRUE))
        return CURLE_OUT_OF_MEMORY;
    }
  }
  return CURLE_OK;
}